

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::LatticeBuilder<OpenMD::SCLattice>::~LatticeBuilder(LatticeBuilder<OpenMD::SCLattice> *this)

{
  void *in_RDI;
  
  ~LatticeBuilder((LatticeBuilder<OpenMD::SCLattice> *)0x1f86c8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual Lattice* create() const { return new ConcreteLattice(); }